

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O2

void just::temp::directory::delete_dir(string *path_)

{
  bool bVar1;
  dir_t d;
  string e;
  string fp;
  dir_t dStack_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dir_t::dir_t(&dStack_c8,path_);
  dir_t::next_file_abi_cxx11_(&local_b0,&dStack_c8);
  while (dStack_c8._eod != true) {
    path_separator_abi_cxx11_();
    std::operator+(&local_70,path_,&local_90);
    std::operator+(&local_50,&local_70,&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    bVar1 = is_directory(&local_50);
    if (bVar1) {
      delete_dir(&local_50);
    }
    else {
      delete_file(&local_50);
    }
    std::__cxx11::string::~string((string *)&local_50);
    dir_t::next_file_abi_cxx11_(&local_50,&dStack_c8);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  dir_t::~dir_t(&dStack_c8);
  delete_empty_dir(path_);
  return;
}

Assistant:

static void delete_dir(const std::string& path_)
      {
        {
          dir_t d(path_);
          for (std::string e = d.next_file(); !d.eod(); e = d.next_file())
          {
            const std::string fp = path_ + path_separator() + e;
            if (is_directory(fp))
            {
              delete_dir(fp);
            }
            else
            {
              delete_file(fp);
            }
          }
        }
        delete_empty_dir(path_);
      }